

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int revnum(int x,int y,int d,char (*board) [8],STATE s,int f)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int local_48;
  int k;
  STATE rs;
  int flag;
  int num;
  int b;
  int a;
  int y0;
  int x0;
  int f_local;
  STATE s_local;
  char (*board_local) [8];
  int d_local;
  int y_local;
  int x_local;
  
  iVar1 = dir[d][0];
  iVar2 = dir[d][1];
  rs = EMPTY;
  bVar4 = false;
  cVar5 = '\x04';
  if (s == WHITE) {
    cVar5 = '\x05';
  }
  d_local = iVar1 + x;
  board_local._4_4_ = iVar2 + y;
  while( true ) {
    bVar3 = false;
    if (((-1 < d_local) && (bVar3 = false, d_local < 8)) && (bVar3 = false, -1 < board_local._4_4_))
    {
      bVar3 = board_local._4_4_ < 8;
    }
    if (!bVar3) goto LAB_00101387;
    if (board[d_local][board_local._4_4_] != cVar5) break;
    rs = rs + WHITE_;
    d_local = iVar1 + d_local;
    board_local._4_4_ = iVar2 + board_local._4_4_;
  }
  if ((int)board[d_local][board_local._4_4_] == s) {
    bVar4 = true;
  }
LAB_00101387:
  if (bVar4) {
    if (f != 0) {
      for (local_48 = 1; local_48 <= (int)rs; local_48 = local_48 + 1) {
        board[x + iVar1 * local_48][y + iVar2 * local_48] = (char)s;
      }
    }
    y_local = rs;
  }
  else {
    y_local = 0;
  }
  return y_local;
}

Assistant:

int revnum(int x, int y, int d, char board[][SIZE], STATE s, int f) {
    int x0 = x, y0 = y;
    int a = dir[d][0], b = dir[d][1];
    int num = 0, flag = 0;
    STATE rs = (s == WHITE ? BLACK : WHITE);
    x += a;
    y += b;
    while (x >= 0 && x < SIZE && y >= 0 && y < SIZE) {
        if (board[x][y] == rs) {
            num++;
        } else if (board[x][y] == s) {
            flag = 1;
            break;
        } else {
            break;
        }
        x += a;
        y += b;
    }
    if (flag) {
        if (f) {
            int k;
            for (k = 1; k <= num; k++) {
                x = x0 + a * k;
                y = y0 + b * k;
                board[x][y] = s;
            }
        }
        return num;
    }
    return 0;
}